

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O0

void __thiscall DIS::FastEntityStatePdu::FastEntityStatePdu(FastEntityStatePdu *this)

{
  int local_24;
  int local_20;
  int lengthmarking;
  int lengthotherParameters;
  FastEntityStatePdu *this_local;
  
  EntityInformationFamilyPdu::EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  (this->super_EntityInformationFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__FastEntityStatePdu_00271ff8;
  *(undefined2 *)&(this->super_EntityInformationFamilyPdu).super_Pdu.field_0x14 = 0;
  *(undefined2 *)&(this->super_EntityInformationFamilyPdu).super_Pdu.field_0x16 = 0;
  this->_entity = 0;
  this->_forceId = '\0';
  this->_numberOfArticulationParameters = '\0';
  this->_entityKind = '\0';
  this->_domain = '\0';
  this->_country = 0;
  this->_category = '\0';
  this->_subcategory = '\0';
  this->_specific = '\0';
  this->_extra = '\0';
  this->_altEntityKind = '\0';
  this->_altDomain = '\0';
  this->_altCountry = 0;
  this->_altCategory = '\0';
  this->_altSubcategory = '\0';
  this->_altSpecific = '\0';
  this->_altExtra = '\0';
  this->_xVelocity = 0.0;
  this->_yVelocity = 0.0;
  this->_zVelocity = 0.0;
  this->_xLocation = 0.0;
  this->_yLocation = 0.0;
  this->_zLocation = 0.0;
  this->_psi = 0.0;
  this->_theta = 0.0;
  this->_phi = 0.0;
  this->_entityAppearance = 0;
  this->_deadReckoningAlgorithm = '\0';
  this->_xAcceleration = 0.0;
  this->_yAcceleration = 0.0;
  this->_zAcceleration = 0.0;
  this->_xAngularVelocity = 0.0;
  this->_yAngularVelocity = 0.0;
  this->_zAngularVelocity = 0.0;
  this->_capabilities = 0;
  std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::vector
            (&this->_articulationParameters);
  Pdu::setPduType((Pdu *)this,'\x01');
  for (local_20 = 0; local_20 < 0xf; local_20 = local_20 + 1) {
    this->_otherParameters[local_20] = '\0';
  }
  for (local_24 = 0; local_24 < 0xc; local_24 = local_24 + 1) {
    this->_marking[local_24] = '\0';
  }
  return;
}

Assistant:

FastEntityStatePdu::FastEntityStatePdu() : EntityInformationFamilyPdu(),
   _site(0), 
   _application(0), 
   _entity(0), 
   _forceId(0), 
   _numberOfArticulationParameters(0), 
   _entityKind(0), 
   _domain(0), 
   _country(0), 
   _category(0), 
   _subcategory(0), 
   _specific(0), 
   _extra(0), 
   _altEntityKind(0), 
   _altDomain(0), 
   _altCountry(0), 
   _altCategory(0), 
   _altSubcategory(0), 
   _altSpecific(0), 
   _altExtra(0), 
   _xVelocity(0.0), 
   _yVelocity(0.0), 
   _zVelocity(0.0), 
   _xLocation(0.0), 
   _yLocation(0.0), 
   _zLocation(0.0), 
   _psi(0.0), 
   _theta(0.0), 
   _phi(0.0), 
   _entityAppearance(0), 
   _deadReckoningAlgorithm(0), 
   _xAcceleration(0.0), 
   _yAcceleration(0.0), 
   _zAcceleration(0.0), 
   _xAngularVelocity(0.0), 
   _yAngularVelocity(0.0), 
   _zAngularVelocity(0.0), 
   _capabilities(0)
{
    setPduType( 1 );
     // Initialize fixed length array
     for(int lengthotherParameters= 0; lengthotherParameters < 15; lengthotherParameters++)
     {
         _otherParameters[lengthotherParameters] = 0;
     }

     // Initialize fixed length array
     for(int lengthmarking= 0; lengthmarking < 12; lengthmarking++)
     {
         _marking[lengthmarking] = 0;
     }

}